

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_4402ef::Db::parse(Db *this)

{
  _func_int **pp_Var1;
  char *pcVar2;
  bool bVar3;
  Node *pNVar4;
  Node *pNVar5;
  SpecialName *pSVar6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  StringView SVar9;
  StringView S;
  StringView S_00;
  Node *Encoding;
  Node *local_30;
  
  SVar9.Last = "";
  SVar9.First = "_Z";
  bVar3 = consumeIf(this,SVar9);
  if (bVar3) {
    pNVar4 = parseEncoding(this);
    if (pNVar4 != (Node *)0x0) {
      pp_Var8 = (_func_int **)this->First;
      pp_Var1 = (_func_int **)this->Last;
      pp_Var7 = pp_Var8;
      if ((pp_Var1 != pp_Var8) && (pp_Var7 = pp_Var1, *(char *)pp_Var8 == '.')) {
        pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar5->K = KDotSuffix;
        pNVar5->RHSComponentCache = No;
        pNVar5->ArrayCache = No;
        pNVar5->FunctionCache = No;
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00203800;
        pNVar5[1]._vptr_Node = (_func_int **)pNVar4;
        *(_func_int ***)&pNVar5[1].K = pp_Var8;
        pNVar5[2]._vptr_Node = pp_Var1;
        pp_Var8 = (_func_int **)this->Last;
        this->First = (char *)pp_Var8;
        pp_Var7 = pp_Var8;
        pNVar4 = pNVar5;
      }
      if (pp_Var7 != pp_Var8) {
        return (Node *)0x0;
      }
      return pNVar4;
    }
  }
  else {
    S.Last = "";
    S.First = "___Z";
    bVar3 = consumeIf(this,S);
    if (!bVar3) {
      pNVar4 = parseType(this);
      if (this->Last != this->First) {
        return (Node *)0x0;
      }
      return pNVar4;
    }
    local_30 = parseEncoding(this);
    if ((local_30 != (Node *)0x0) &&
       (S_00.Last = "", S_00.First = "_block_invoke", bVar3 = consumeIf(this,S_00), bVar3)) {
      pcVar2 = this->First;
      if ((pcVar2 == this->Last) || (*pcVar2 != '_')) {
        parseNumber(this,false);
      }
      else {
        this->First = pcVar2 + 1;
        SVar9 = parseNumber(this,false);
        if (SVar9.First == SVar9.Last) {
          return (Node *)0x0;
        }
      }
      if (this->Last == this->First) {
        pSVar6 = (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::SpecialName,char_const(&)[34],(anonymous_namespace)::Node*&>
                           ((Db *)this,(char (*) [34])"invocation function for block in ",&local_30)
        ;
        return &pSVar6->super_Node;
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parse() {
  if (consumeIf("_Z")) {
    Node *Encoding = parseEncoding();
    if (Encoding == nullptr)
      return nullptr;
    if (look() == '.') {
      Encoding = make<DotSuffix>(Encoding, StringView(First, Last));
      First = Last;
    }
    if (numLeft() != 0)
      return nullptr;
    return Encoding;
  }

  if (consumeIf("___Z")) {
    Node *Encoding = parseEncoding();
    if (Encoding == nullptr || !consumeIf("_block_invoke"))
      return nullptr;
    bool RequireNumber = consumeIf('_');
    if (parseNumber().empty() && RequireNumber)
      return nullptr;
    if (numLeft() != 0)
      return nullptr;
    return make<SpecialName>("invocation function for block in ", Encoding);
  }

  Node *Ty = parseType();
  if (numLeft() != 0)
    return nullptr;
  return Ty;
}